

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::requantize_from_int32_to_int8
               (Mat *src,Mat *dst,Mat *scale_in_data,Mat *scale_out_data,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  Layer *pLVar3;
  long lVar4;
  undefined8 uStack_168;
  undefined8 auStack_15c [2];
  undefined8 uStack_148;
  undefined1 auStack_140 [8];
  undefined1 auStack_13c [8];
  undefined8 uStack_134;
  Mat local_128;
  Mat local_e0;
  Mat local_98;
  Mat *local_50;
  Mat *local_48;
  ModelBinFromMatArray local_40;
  
  auStack_140 = (undefined1  [8])0x18498c;
  local_50 = src;
  local_48 = dst;
  pLVar3 = create_layer(0x3f);
  auStack_140 = (undefined1  [8])0x18499a;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4));
  auStack_140 = (undefined1  [8])0x1849a8;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4),0,
                 scale_in_data->w);
  auStack_140 = (undefined1  [8])0x1849b8;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4),1,
                 scale_out_data->w);
  auStack_140 = (undefined1  [8])0x1849ca;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4),2,bias_data->w
                );
  auStack_140 = (undefined1  [8])0x1849da;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4),3,
                 activation_type);
  auStack_140 = (undefined1  [8])0x1849ef;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4),4,
                 activation_params);
  auStack_140 = (undefined1  [8])0x1849fb;
  (*pLVar3->_vptr_Layer[2])(pLVar3,(undefined1 *)((long)register0x00000020 + -0x13c) + 4);
  lVar4 = 0x40;
  do {
    *(undefined8 *)((long)&local_128.data + lVar4) = 0;
    *(undefined8 *)((long)&uStack_168 + lVar4) = 0;
    *(undefined8 *)(&stack0xfffffffffffffea0 + lVar4) = 0;
    *(undefined8 *)((long)auStack_15c + lVar4) = 0;
    *(undefined8 *)((long)auStack_15c + lVar4 + 8) = 0;
    *(undefined8 *)((long)&uStack_148 + lVar4) = 0;
    *(undefined8 *)(&stack0xfffffffffffffec0 + lVar4) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0x13c) + lVar4) = 0;
    *(undefined8 *)((long)&uStack_134 + lVar4) = 0;
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0x118);
  if (&local_128 != scale_in_data) {
    piVar1 = scale_in_data->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            auStack_140 = (undefined1  [8])0x184a81;
            free(local_128.data);
          }
        }
        else {
          auStack_140 = (undefined1  [8])0x184a72;
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_128.data = scale_in_data->data;
    local_128.refcount._0_4_ = SUB84(scale_in_data->refcount,0);
    local_128.refcount._4_4_ = (undefined4)((ulong)scale_in_data->refcount >> 0x20);
    local_128.elemsize._0_4_ = (undefined4)scale_in_data->elemsize;
    local_128.elemsize._4_4_ = (undefined4)(scale_in_data->elemsize >> 0x20);
    local_128.elempack = scale_in_data->elempack;
    local_128.allocator = scale_in_data->allocator;
    local_128.dims = scale_in_data->dims;
    local_128.w = scale_in_data->w;
    local_128.h = scale_in_data->h;
    local_128.d = scale_in_data->d;
    local_128.c = scale_in_data->c;
    local_128.cstep = scale_in_data->cstep;
  }
  if (&local_e0 != scale_out_data) {
    piVar1 = scale_out_data->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_e0.refcount._4_4_,local_e0.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_e0.allocator == (Allocator *)0x0) {
          if (local_e0.data != (void *)0x0) {
            auStack_140 = (undefined1  [8])0x184b2f;
            free(local_e0.data);
          }
        }
        else {
          auStack_140 = (undefined1  [8])0x184b20;
          (*(local_e0.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_e0.data = scale_out_data->data;
    local_e0.refcount._0_4_ = SUB84(scale_out_data->refcount,0);
    local_e0.refcount._4_4_ = (undefined4)((ulong)scale_out_data->refcount >> 0x20);
    local_e0.elemsize._0_4_ = (undefined4)scale_out_data->elemsize;
    local_e0.elemsize._4_4_ = (undefined4)(scale_out_data->elemsize >> 0x20);
    local_e0.elempack = scale_out_data->elempack;
    local_e0.allocator = scale_out_data->allocator;
    local_e0.dims = scale_out_data->dims;
    local_e0.w = scale_out_data->w;
    local_e0.h = scale_out_data->h;
    local_e0.d = scale_out_data->d;
    local_e0.c = scale_out_data->c;
    local_e0.cstep = scale_out_data->cstep;
  }
  if (&local_98 != bias_data) {
    piVar1 = bias_data->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if (local_98.data != (void *)0x0) {
            auStack_140 = (undefined1  [8])0x184bf8;
            free(local_98.data);
          }
        }
        else {
          auStack_140 = (undefined1  [8])0x184be9;
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.data = bias_data->data;
    local_98.refcount._0_4_ = SUB84(bias_data->refcount,0);
    local_98.refcount._4_4_ = (undefined4)((ulong)bias_data->refcount >> 0x20);
    local_98.elemsize._0_4_ = (undefined4)bias_data->elemsize;
    local_98.elemsize._4_4_ = (undefined4)(bias_data->elemsize >> 0x20);
    local_98.elempack = bias_data->elempack;
    local_98.allocator = bias_data->allocator;
    local_98.dims = bias_data->dims;
    local_98.w = bias_data->w;
    local_98.h = bias_data->h;
    local_98.d = bias_data->d;
    local_98.c = bias_data->c;
    local_98.cstep = bias_data->cstep;
  }
  auStack_140 = (undefined1  [8])0x184c8f;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_128);
  auStack_140 = (undefined1  [8])0x184ca0;
  (*pLVar3->_vptr_Layer[3])(pLVar3,&local_40);
  auStack_140 = (undefined1  [8])0x184cad;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
  auStack_140 = (undefined1  [8])0x184cb9;
  (*pLVar3->_vptr_Layer[4])(pLVar3,opt);
  auStack_140 = (undefined1  [8])0x184cd5;
  (*pLVar3->_vptr_Layer[7])(pLVar3,local_50,local_48,opt);
  auStack_140 = (undefined1  [8])0x184ce1;
  (*pLVar3->_vptr_Layer[5])(pLVar3,opt);
  auStack_140 = (undefined1  [8])0x184cea;
  (*pLVar3->_vptr_Layer[1])(pLVar3);
  lVar4 = 0x90;
  do {
    piVar1 = *(int **)((long)&local_128.refcount + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_128.data + lVar4);
        plVar2 = *(long **)((long)&local_128.allocator + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            auStack_140 = (undefined1  [8])0x184d28;
            free(__ptr);
          }
        }
        else {
          auStack_140 = (undefined1  [8])0x184d16;
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_128.cstep + lVar4) = 0;
    *(undefined8 *)((long)&local_128.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_128.elemsize + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_128.data + lVar4) = 0;
    *(undefined8 *)((long)&local_128.refcount + lVar4) = 0;
    *(undefined8 *)((long)&local_128.dims + lVar4) = 0;
    *(undefined8 *)((long)&local_128.h + lVar4) = 0;
    *(undefined4 *)((long)&local_128.c + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x48);
  auStack_140 = (undefined1  [8])0x184d5f;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0x13c) + 4));
  return;
}

Assistant:

void requantize_from_int32_to_int8(const Mat& src, Mat& dst, const Mat& scale_in_data, const Mat& scale_out_data, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
    Layer* requantize = create_layer(LayerType::Requantize);

    ParamDict pd;
    pd.set(0, scale_in_data.w);
    pd.set(1, scale_out_data.w);
    pd.set(2, bias_data.w);
    pd.set(3, activation_type);
    pd.set(4, activation_params);

    requantize->load_param(pd);

    Mat weights[3];
    weights[0] = scale_in_data;
    weights[1] = scale_out_data;
    weights[2] = bias_data;

    requantize->load_model(ModelBinFromMatArray(weights));

    requantize->create_pipeline(opt);

    requantize->forward(src, dst, opt);

    requantize->destroy_pipeline(opt);

    delete requantize;
}